

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::RemoveExportBuildFileGeneratorCMP0024(cmMakefile *this,cmExportBuildFileGenerator *gen)

{
  cmExportBuildFileGenerator **__src;
  pointer *pppcVar1;
  cmExportBuildFileGenerator **ppcVar2;
  __normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
  __dest;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<cmExportBuildFileGenerator**,std::vector<cmExportBuildFileGenerator*,std::allocator<cmExportBuildFileGenerator*>>>,__gnu_cxx::__ops::_Iter_equals_val<cmExportBuildFileGenerator*const>>
                     ((this->ExportBuildFileGenerators).
                      super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->ExportBuildFileGenerators).
                      super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  ppcVar2 = (this->ExportBuildFileGenerators).
            super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != ppcVar2) {
    __src = __dest._M_current + 1;
    if (__src != ppcVar2) {
      memmove(__dest._M_current,__src,(long)ppcVar2 - (long)__src);
    }
    pppcVar1 = &(this->ExportBuildFileGenerators).
                super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + -1;
  }
  return;
}

Assistant:

void cmMakefile::RemoveExportBuildFileGeneratorCMP0024(
    cmExportBuildFileGenerator* gen)
{
  std::vector<cmExportBuildFileGenerator*>::iterator it =
      std::find(this->ExportBuildFileGenerators.begin(),
                this->ExportBuildFileGenerators.end(), gen);
  if(it != this->ExportBuildFileGenerators.end())
    {
    this->ExportBuildFileGenerators.erase(it);
    }
}